

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O0

uint __thiscall
tchecker::
variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::id(variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     *this,string *name)

{
  bool bVar1;
  invalid_argument *this_00;
  reference e;
  uint *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [16];
  const_value_map_iterator_t it;
  string *name_local;
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  it.m_ptr = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)name;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::find_value((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_28 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::end_value_map((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_28);
  bVar1 = boost::container::operator==
                    ((vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_true>
                      *)(local_28 + 8),
                     (vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_true>
                      *)local_28);
  if (!bVar1) {
    e = boost::container::
        vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_true>
        ::operator*((vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_true>
                     *)(local_28 + 8));
    puVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::key(&this->_index,e);
    return *puVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"unknown variable ",&(it.m_ptr)->first);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline ID id(std::string const & name) const
  {
    auto it = _index.find_value(name);
    if (it == _index.end_value_map())
      throw std::invalid_argument("unknown variable " + name);
    return _index.key(*it);
  }